

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint16 ma_dr_wav_fmt_get_format(ma_dr_wav_fmt *pFMT)

{
  ma_uint16 *in_RDI;
  ma_uint16 local_2;
  
  if (in_RDI == (ma_uint16 *)0x0) {
    local_2 = 0;
  }
  else if (*in_RDI == 0xfffe) {
    local_2 = ma_dr_wav_bytes_to_u16((ma_uint8 *)(in_RDI + 0xc));
  }
  else {
    local_2 = *in_RDI;
  }
  return local_2;
}

Assistant:

MA_API ma_uint16 ma_dr_wav_fmt_get_format(const ma_dr_wav_fmt* pFMT)
{
    if (pFMT == NULL) {
        return 0;
    }
    if (pFMT->formatTag != MA_DR_WAVE_FORMAT_EXTENSIBLE) {
        return pFMT->formatTag;
    } else {
        return ma_dr_wav_bytes_to_u16(pFMT->subFormat);
    }
}